

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O2

void __thiscall crnlib::dxt1_block::flip_y(dxt1_block *this,uint w,uint h)

{
  byte bVar1;
  byte bVar2;
  uint y;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  bool bVar7;
  
  for (uVar3 = 0; uVar3 != h >> 1; uVar3 = uVar3 + 1) {
    uVar4 = ~(uint)uVar3 + h;
    bVar2 = 0;
    uVar5 = w;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      bVar1 = this->m_selectors[uVar3];
      bVar6 = ~(byte)(3 << (bVar2 & 0x1f));
      this->m_selectors[uVar3] =
           (byte)((this->m_selectors[uVar4] >> (bVar2 & 0x1f) & 3) << (bVar2 & 0x1f)) |
           bVar1 & bVar6;
      this->m_selectors[uVar4] =
           (byte)((bVar1 >> (bVar2 & 0x1f) & 3) << (bVar2 & 0x1f)) |
           bVar6 & this->m_selectors[uVar4];
      bVar2 = bVar2 + 2;
    }
  }
  return;
}

Assistant:

inline void flip_y(uint w = 4, uint h = 4)
        {
            for (uint y = 0; y < (h / 2); y++)
            {
                for (uint x = 0; x < w; x++)
                {
                    const uint c = get_selector(x, y);
                    set_selector(x, y, get_selector(x, (h - 1) - y));
                    set_selector(x, (h - 1) - y, c);
                }
            }
        }